

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall wallet::wallet_tests::importmulti_rescan::test_method(importmulti_rescan *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CKey *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppCVar2;
  ChainstateManager *pCVar3;
  uint256 *puVar4;
  undefined8 uVar5;
  UniValue *pUVar6;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  MockableData records;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  base_blob<256U> *pbVar7;
  int iVar8;
  Chainstate *pCVar9;
  CBlockFileInfo *pCVar10;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar11;
  undefined4 uVar12;
  uint fileNumber;
  char *pcVar13;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *__args_2;
  CBlockIndex *pCVar14;
  CBlockIndex *pCVar15;
  long in_FS_OFFSET;
  initializer_list<int> __l;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  const_string file;
  const_string msg;
  undefined8 in_stack_fffffffffffff6a8;
  undefined8 in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c4;
  _func_int **in_stack_fffffffffffff6c8;
  bool in_stack_fffffffffffff6d0;
  undefined7 in_stack_fffffffffffff6d1;
  undefined8 in_stack_fffffffffffff6d8;
  undefined8 in_stack_fffffffffffff6e0;
  undefined8 in_stack_fffffffffffff6e8;
  undefined8 in_stack_fffffffffffff6f0;
  pointer in_stack_fffffffffffff6f8;
  undefined8 local_900;
  undefined1 local_8f8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_8f0;
  WalletContext context;
  shared_ptr<wallet::CWallet> wallet;
  string *local_868;
  undefined **local_860;
  undefined1 local_858;
  undefined1 *local_850;
  string **local_848;
  UniValue *local_840;
  char *local_838;
  char *local_830;
  assertion_result local_828;
  string local_810;
  size_type *local_7f0;
  _Alloc_hider local_7e8;
  size_type local_7e0 [2];
  undefined1 local_7d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  undefined1 local_7b0 [16];
  pointer local_7a0;
  _Alloc_hider local_790;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  vector<RPCArg,_std::allocator<RPCArg>_> local_770;
  vector<RPCResult,_std::allocator<RPCResult>_> local_758;
  _Alloc_hider local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730;
  UniValue response;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_698;
  vector<UniValue,_std::allocator<UniValue>_> local_680;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  undefined8 auStack_650 [8];
  bool local_610;
  _Alloc_hider local_608;
  size_type local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  UniValue local_5e8;
  Mode local_590;
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  _Alloc_hider local_568;
  size_type local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Alloc_hider local_548;
  size_type local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  any local_528;
  JSONRPCVersion local_518;
  VType local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  vector<UniValue,_std::allocator<UniValue>_> local_4c8;
  UniValue local_4b0;
  long *local_458 [2];
  long local_448 [2];
  UniValue local_438;
  long *local_3e0 [2];
  long local_3d0 [2];
  UniValue local_3c0;
  long *local_368 [2];
  long local_358 [2];
  VType local_348;
  long *local_340 [2];
  long local_330 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  vector<UniValue,_std::allocator<UniValue>_> local_308;
  UniValue local_2f0;
  long *local_298 [2];
  long local_288 [2];
  UniValue local_278;
  long *local_220 [2];
  long local_210 [2];
  UniValue local_200;
  long *local_1a8 [2];
  long local_198 [2];
  UniValue key;
  UniValue keys;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_d8;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xc9,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xc9,"operator()","m_node.chainman");
  criticalblock30.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock30.super_unique_lock._8_8_ =
       criticalblock30.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock30.super_unique_lock);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar9->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar9->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar14 = (CBlockIndex *)0x0;
  }
  else {
    pCVar14 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  criticalblock30.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock30.super_unique_lock._8_8_ =
       criticalblock30.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock30.super_unique_lock);
  pCVar10 = ::node::BlockManager::GetBlockFileInfo
                      (&((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                        m_blockman,
                       (long)(int)(-(uint)((pCVar14->nStatus & 8) == 0) | pCVar14->nFile));
  pCVar10->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  context.chain = (Chain *)0x0;
  context.scheduler = (CScheduler *)0x0;
  context.args = (ArgsManager *)0x0;
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  CKey::GetPubKey((CPubKey *)&criticalblock30,this_00);
  GetScriptForRawPubKey((CScript *)local_7d0,(CPubKey *)&criticalblock30);
  TestChain100Setup::CreateAndProcessBlock
            (&local_a8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&context,
             (CScript *)local_7d0,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  if (0x1c < (uint)local_7c0._12_4_) {
    free((void *)local_7d0._0_8_);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&context);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xcc,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0xcc,"operator()","m_node.chainman");
  criticalblock30.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock30.super_unique_lock._8_8_ =
       criticalblock30.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock30.super_unique_lock);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar9->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar9->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar15 = (CBlockIndex *)0x0;
  }
  else {
    pCVar15 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  criticalblock30.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock30.super_unique_lock._8_8_ =
       criticalblock30.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock30.super_unique_lock);
  fileNumber = -(uint)((pCVar14->nStatus & 8) == 0) | pCVar14->nFile;
  puVar11 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                       ,0xd3,"test_method","m_node.chainman");
  ::node::BlockManager::PruneOneBlockFile
            (&((puVar11->_M_t).
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
             fileNumber);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  pCVar3 = (val->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  local_7d0._0_4_ = fileNumber;
  __l._M_len = 1;
  __l._M_array = (iterator)local_7d0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock30,__l,
             (less<int> *)&context,(allocator_type *)&keys);
  ::node::BlockManager::UnlinkPrunedFiles
            (&pCVar3->m_blockman,(set<int,_std::less<int>,_std::allocator<int>_> *)&criticalblock30)
  ;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &criticalblock30);
  criticalblock30.super_unique_lock._M_device =
       (mutex_type *)
       (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
       super_BasicTestingSetup.m_node.chain._M_t.
       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pCVar14;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff6a8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff6b8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = in_stack_fffffffffffff6c0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = in_stack_fffffffffffff6c4;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff6c8;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = in_stack_fffffffffffff6d0;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = in_stack_fffffffffffff6d1;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)local_7d0,records);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pcVar13 = "";
  __args_2 = (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             local_7d0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::CWallet,std::allocator<wallet::CWallet>,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CWallet **)&wallet,(allocator<wallet::CWallet> *)&context,(Chain **)&criticalblock30,
             (char (*) [1])0xf4aea1,__args_2);
  if ((long *)local_7d0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_7d0._0_8_ + 8))();
  }
  local_7d0._0_8_ = (char *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_d8);
  CWallet::SetupLegacyScriptPubKeyMan
            (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_7d0._0_8_ =
       &(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cs_wallet;
  local_7d0[8] = '\0';
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_7d0);
  puVar4 = pCVar15->phashBlock;
  if (puVar4 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  criticalblock30.super_unique_lock._M_device =
       *(mutex_type **)(puVar4->super_base_blob<256U>).m_data._M_elems;
  pbVar7 = &puVar4->super_base_blob<256U>;
  criticalblock30.super_unique_lock._M_owns = (bool)(pbVar7->m_data)._M_elems[8];
  criticalblock30.super_unique_lock._9_1_ = (pbVar7->m_data)._M_elems[9];
  criticalblock30.super_unique_lock._10_1_ = (pbVar7->m_data)._M_elems[10];
  criticalblock30.super_unique_lock._11_1_ = (pbVar7->m_data)._M_elems[0xb];
  criticalblock30.super_unique_lock._12_1_ = (pbVar7->m_data)._M_elems[0xc];
  criticalblock30.super_unique_lock._13_1_ = (pbVar7->m_data)._M_elems[0xd];
  criticalblock30.super_unique_lock._14_1_ = (pbVar7->m_data)._M_elems[0xe];
  criticalblock30.super_unique_lock._15_1_ = (pbVar7->m_data)._M_elems[0xf];
  uVar5 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
  auStack_650[0] = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
  (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_last_block_processed_height = pCVar15->nHeight;
  *(mutex_type **)
   ((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
   m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
       criticalblock30.super_unique_lock._M_device;
  pbVar7 = &((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_last_block_processed).super_base_blob<256U>;
  (pbVar7->m_data)._M_elems[8] = criticalblock30.super_unique_lock._M_owns;
  (pbVar7->m_data)._M_elems[9] = criticalblock30.super_unique_lock._9_1_;
  (pbVar7->m_data)._M_elems[10] = criticalblock30.super_unique_lock._10_1_;
  (pbVar7->m_data)._M_elems[0xb] = criticalblock30.super_unique_lock._11_1_;
  (pbVar7->m_data)._M_elems[0xc] = criticalblock30.super_unique_lock._12_1_;
  (pbVar7->m_data)._M_elems[0xd] = criticalblock30.super_unique_lock._13_1_;
  (pbVar7->m_data)._M_elems[0xe] = criticalblock30.super_unique_lock._14_1_;
  (pbVar7->m_data)._M_elems[0xf] = criticalblock30.super_unique_lock._15_1_;
  *(undefined8 *)
   (((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar5;
  *(undefined8 *)
   (((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) = auStack_650[0];
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_7d0);
  WalletContext::WalletContext(&context);
  context.args = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                  super_BasicTestingSetup.m_args;
  AddWallet(&context,&wallet);
  keys.val._M_dataplus._M_p = (pointer)&keys.val.field_2;
  keys.val._M_string_length = 0;
  keys.val.field_2._M_local_buf[0] = '\0';
  keys.typ = VNULL;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::UniValue::setArray(&keys);
  key.val._M_dataplus._M_p = (pointer)&key.val.field_2;
  key.val._M_string_length = 0;
  key.val.field_2._M_local_buf[0] = '\0';
  key.typ = VNULL;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  ::UniValue::setObject(&key);
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"scriptPubKey","");
  CKey::GetPubKey((CPubKey *)&criticalblock30,this_00);
  GetScriptForRawPubKey((CScript *)&response,(CPubKey *)&criticalblock30);
  uVar12 = response.val.field_2._M_allocated_capacity._4_4_ + -0x1d;
  pUVar6 = (UniValue *)response._0_8_;
  if ((uint)response.val.field_2._M_allocated_capacity._4_4_ < 0x1d) {
    uVar12 = response.val.field_2._M_allocated_capacity._4_4_;
    pUVar6 = &response;
  }
  s.m_size._0_4_ = uVar12;
  s.m_data = (uchar *)pUVar6;
  s.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)local_7d0,s);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d0);
  key_00._M_string_length = (size_type)pCVar14;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  key_00.field_2._8_4_ = in_stack_fffffffffffff6c0;
  key_00.field_2._12_4_ = in_stack_fffffffffffff6c4;
  val_03.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff6d0;
  val_03._0_8_ = in_stack_fffffffffffff6c8;
  val_03.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffff6d1;
  val_03.val._M_string_length = in_stack_fffffffffffff6d8;
  val_03.val.field_2._M_allocated_capacity = in_stack_fffffffffffff6e0;
  val_03.val.field_2._8_8_ = in_stack_fffffffffffff6e8;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6f0;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f8;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_900;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8f8;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8f0._M_head_impl;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.chain;
  ::UniValue::pushKV(&key,key_00,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_200.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.val._M_dataplus._M_p != &local_200.val.field_2) {
    operator_delete(local_200.val._M_dataplus._M_p,local_200.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._0_8_ != &local_7c0) {
    operator_delete((void *)local_7d0._0_8_,local_7c0._M_allocated_capacity + 1);
  }
  if (0x1c < (uint)response.val.field_2._M_allocated_capacity._4_4_) {
    free((void *)response._0_8_);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"timestamp","");
  criticalblock30.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock30.super_unique_lock._M_device & 0xffffffff00000000);
  ::UniValue::UniValue<int,_int,_true>(&local_278,(int *)&criticalblock30);
  key_01._M_string_length = (size_type)pCVar14;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  key_01.field_2._8_4_ = in_stack_fffffffffffff6c0;
  key_01.field_2._12_4_ = in_stack_fffffffffffff6c4;
  val_04.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff6d0;
  val_04._0_8_ = in_stack_fffffffffffff6c8;
  val_04.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffff6d1;
  val_04.val._M_string_length = in_stack_fffffffffffff6d8;
  val_04.val.field_2._M_allocated_capacity = in_stack_fffffffffffff6e0;
  val_04.val.field_2._8_8_ = in_stack_fffffffffffff6e8;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6f0;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f8;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_900;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8f8;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8f0._M_head_impl;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.chain;
  ::UniValue::pushKV(&key,key_01,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_278.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.val._M_dataplus._M_p != &local_278.val.field_2) {
    operator_delete(local_278.val._M_dataplus._M_p,local_278.val.field_2._M_allocated_capacity + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"internal","");
  criticalblock30.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock30.super_unique_lock._M_device._1_7_,1);
  ::UniValue::UniValue<bool,_bool,_true>(&local_2f0,(bool *)&criticalblock30);
  key_02._M_string_length = (size_type)pCVar14;
  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  key_02.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  key_02.field_2._8_4_ = in_stack_fffffffffffff6c0;
  key_02.field_2._12_4_ = in_stack_fffffffffffff6c4;
  val_05.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff6d0;
  val_05._0_8_ = in_stack_fffffffffffff6c8;
  val_05.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffff6d1;
  val_05.val._M_string_length = in_stack_fffffffffffff6d8;
  val_05.val.field_2._M_allocated_capacity = in_stack_fffffffffffff6e0;
  val_05.val.field_2._8_8_ = in_stack_fffffffffffff6e8;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6f0;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f8;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_900;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8f8;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8f0._M_head_impl;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.chain;
  ::UniValue::pushKV(&key,key_02,val_05);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2f0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.val._M_dataplus._M_p != &local_2f0.val.field_2) {
    operator_delete(local_2f0.val._M_dataplus._M_p,local_2f0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  local_348 = key.typ;
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_340,key.val._M_dataplus._M_p,
             key.val._M_dataplus._M_p + key.val._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_320,&key.keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_308,&key.values);
  val_00.val._M_dataplus._M_p = (pointer)pCVar14;
  val_00._0_8_ = in_stack_fffffffffffff6a8;
  val_00.val._M_string_length = in_stack_fffffffffffff6b8;
  val_00.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff6c0;
  val_00.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff6c4;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffff6c8;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_fffffffffffff6d0;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_fffffffffffff6d1;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6d8;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff6e0;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6e8;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f0;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff6f8;
  ::UniValue::push_back(&keys,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_320);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  ::UniValue::clear(&key);
  ::UniValue::setObject(&key);
  GenerateRandomKey(SUB81(local_8f8,0));
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"scriptPubKey","");
  CKey::GetPubKey((CPubKey *)&criticalblock30,(CKey *)local_8f8);
  GetScriptForRawPubKey((CScript *)&response,(CPubKey *)&criticalblock30);
  uVar12 = response.val.field_2._M_allocated_capacity._4_4_ + -0x1d;
  pUVar6 = (UniValue *)response._0_8_;
  if ((uint)response.val.field_2._M_allocated_capacity._4_4_ < 0x1d) {
    uVar12 = response.val.field_2._M_allocated_capacity._4_4_;
    pUVar6 = &response;
  }
  s_00.m_size._0_4_ = uVar12;
  s_00.m_data = (uchar *)pUVar6;
  s_00.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)local_7d0,s_00);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d0);
  key_03._M_string_length = (size_type)pCVar14;
  key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  key_03.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  key_03.field_2._8_4_ = in_stack_fffffffffffff6c0;
  key_03.field_2._12_4_ = in_stack_fffffffffffff6c4;
  val_06.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff6d0;
  val_06._0_8_ = in_stack_fffffffffffff6c8;
  val_06.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffff6d1;
  val_06.val._M_string_length = in_stack_fffffffffffff6d8;
  val_06.val.field_2._M_allocated_capacity = in_stack_fffffffffffff6e0;
  val_06.val.field_2._8_8_ = in_stack_fffffffffffff6e8;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6f0;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f8;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_900;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8f8;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8f0._M_head_impl;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.chain;
  ::UniValue::pushKV(&key,key_03,val_06);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0.val._M_dataplus._M_p != &local_3c0.val.field_2) {
    operator_delete(local_3c0.val._M_dataplus._M_p,local_3c0.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._0_8_ != &local_7c0) {
    operator_delete((void *)local_7d0._0_8_,local_7c0._M_allocated_capacity + 1);
  }
  if (0x1c < (uint)response.val.field_2._M_allocated_capacity._4_4_) {
    free((void *)response._0_8_);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"timestamp","");
  criticalblock30.super_unique_lock._M_device = (mutex_type *)((ulong)pCVar15->nTimeMax + 0x1c21);
  ::UniValue::UniValue<long,_long,_true>(&local_438,(long *)&criticalblock30);
  key_04._M_string_length = (size_type)pCVar14;
  key_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  key_04.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  key_04.field_2._8_4_ = in_stack_fffffffffffff6c0;
  key_04.field_2._12_4_ = in_stack_fffffffffffff6c4;
  val_07.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff6d0;
  val_07._0_8_ = in_stack_fffffffffffff6c8;
  val_07.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffff6d1;
  val_07.val._M_string_length = in_stack_fffffffffffff6d8;
  val_07.val.field_2._M_allocated_capacity = in_stack_fffffffffffff6e0;
  val_07.val.field_2._8_8_ = in_stack_fffffffffffff6e8;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6f0;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f8;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_900;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8f8;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8f0._M_head_impl;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.chain;
  ::UniValue::pushKV(&key,key_04,val_07);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_438.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_438.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.val._M_dataplus._M_p != &local_438.val.field_2) {
    operator_delete(local_438.val._M_dataplus._M_p,local_438.val.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0[0] != local_3d0) {
    operator_delete(local_3e0[0],local_3d0[0] + 1);
  }
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"internal","");
  criticalblock30.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock30.super_unique_lock._M_device._1_7_,1);
  ::UniValue::UniValue<bool,_bool,_true>(&local_4b0,(bool *)&criticalblock30);
  key_05._M_string_length = (size_type)pCVar14;
  key_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  key_05.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  key_05.field_2._8_4_ = in_stack_fffffffffffff6c0;
  key_05.field_2._12_4_ = in_stack_fffffffffffff6c4;
  val_08.val._M_dataplus._M_p._0_1_ = in_stack_fffffffffffff6d0;
  val_08._0_8_ = in_stack_fffffffffffff6c8;
  val_08.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffff6d1;
  val_08.val._M_string_length = in_stack_fffffffffffff6d8;
  val_08.val.field_2._M_allocated_capacity = in_stack_fffffffffffff6e0;
  val_08.val.field_2._8_8_ = in_stack_fffffffffffff6e8;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6f0;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f8;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_900;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_8f8;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_8f0._M_head_impl;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context.chain;
  ::UniValue::pushKV(&key,key_05,val_08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0.val._M_dataplus._M_p != &local_4b0.val.field_2) {
    operator_delete(local_4b0.val._M_dataplus._M_p,local_4b0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  local_508 = key.typ;
  paVar1 = &key.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)key.val._M_dataplus._M_p == paVar1) {
    local_4f0._8_8_ = key.val.field_2._8_8_;
    local_500 = &local_4f0;
  }
  else {
    local_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)key.val._M_dataplus._M_p;
  }
  local_4f0._M_allocated_capacity._1_7_ = key.val.field_2._M_allocated_capacity._1_7_;
  local_4f0._M_local_buf[0] = key.val.field_2._M_local_buf[0];
  local_4f8 = key.val._M_string_length;
  key.val._M_string_length = 0;
  key.val.field_2._M_local_buf[0] = '\0';
  local_4e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       key.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       key.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_4e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       key.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_4c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  key.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  val_01.val._M_dataplus._M_p = (pointer)pCVar14;
  val_01._0_8_ = in_stack_fffffffffffff6a8;
  val_01.val._M_string_length = in_stack_fffffffffffff6b8;
  val_01.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff6c0;
  val_01.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff6c4;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffff6c8;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_fffffffffffff6d0;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_fffffffffffff6d1;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6d8;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff6e0;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6e8;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f0;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff6f8;
  key.val._M_dataplus._M_p = (pointer)paVar1;
  ::UniValue::push_back(&keys,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e0);
  if (local_500 != &local_4f0) {
    operator_delete(local_500,local_4f0._M_allocated_capacity + 1);
  }
  criticalblock30.super_unique_lock._8_8_ = auStack_650;
  criticalblock30.super_unique_lock._M_device =
       (mutex_type *)((ulong)criticalblock30.super_unique_lock._M_device & 0xffffffff00000000);
  auStack_650[0] = auStack_650[0] & 0xffffffffffffff00;
  auStack_650[2] = (pointer)0x0;
  auStack_650[3] = (pointer)0x0;
  auStack_650[4] = (pointer)0x0;
  auStack_650[5] = (pointer)0x0;
  auStack_650[6] = (pointer)0x0;
  auStack_650[7] = (pointer)0x0;
  local_610 = true;
  local_608._M_p = (pointer)&local_5f8;
  local_600 = 0;
  local_5f8._M_local_buf[0] = '\0';
  local_5e8.val._M_dataplus._M_p = (pointer)&local_5e8.val.field_2;
  local_5e8.val._M_string_length = 0;
  local_5e8.val.field_2._M_local_buf[0] = '\0';
  local_5e8.typ = VNULL;
  local_588._M_p = (pointer)&local_578;
  local_5e8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_590 = EXECUTE;
  local_580 = 0;
  local_578._M_local_buf[0] = '\0';
  local_568._M_p = (pointer)&local_558;
  local_560 = 0;
  local_558._M_local_buf[0] = '\0';
  local_548._M_p = (pointer)&local_538;
  local_540 = 0;
  local_538._M_local_buf[0] = '\0';
  local_528._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_528._M_storage._M_ptr = (void *)0x0;
  local_518 = V1_LEGACY;
  local_7d0._0_8_ = &context;
  std::any::operator=(&local_528,(WalletContext **)local_7d0);
  paVar1 = &keys.val.field_2;
  ::UniValue::setArray(&local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)keys.val._M_dataplus._M_p == paVar1) {
    local_6a8._8_8_ = keys.val.field_2._8_8_;
    local_6b8 = &local_6a8;
  }
  else {
    local_6b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)keys.val._M_dataplus._M_p;
  }
  local_6a8._M_allocated_capacity._1_7_ = keys.val.field_2._M_allocated_capacity._1_7_;
  local_6a8._M_local_buf[0] = keys.val.field_2._M_local_buf[0];
  keys.val._M_string_length = 0;
  keys.val.field_2._M_local_buf[0] = '\0';
  local_698.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       keys.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_698.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       keys.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_698.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       keys.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_680.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_680.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_680.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keys.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  val_02.val._M_dataplus._M_p = (pointer)pCVar14;
  val_02._0_8_ = in_stack_fffffffffffff6a8;
  val_02.val._M_string_length = in_stack_fffffffffffff6b8;
  val_02.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff6c0;
  val_02.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff6c4;
  val_02.val.field_2._8_8_ = in_stack_fffffffffffff6c8;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = in_stack_fffffffffffff6d0;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = in_stack_fffffffffffff6d1;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6d8;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff6e0;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6e8;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff6f0;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff6f8;
  keys.val._M_dataplus._M_p = (pointer)paVar1;
  ::UniValue::push_back(&local_5e8,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_680);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_698);
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8,local_6a8._M_allocated_capacity + 1);
  }
  importmulti();
  RPCHelpMan::HandleRequest(&response,(RPCHelpMan *)local_7d0,(JSONRPCRequest *)&criticalblock30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_p != &local_730) {
    operator_delete(local_740._M_p,local_730._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_758);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_770);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_p != &local_780) {
    operator_delete(local_790._M_p,local_780._M_allocated_capacity + 1);
  }
  if (local_7a0 != (pointer)0x0) {
    (*(code *)local_7a0)(local_7b0,local_7b0,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._0_8_ != &local_7c0) {
    operator_delete((void *)local_7d0._0_8_,local_7c0._M_allocated_capacity + 1);
  }
  file.m_end = (iterator)0xfe;
  file.m_begin = &stack0xfffffffffffff6f8;
  msg.m_end = (iterator)__args_2;
  msg.m_begin = pcVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&stack0xfffffffffffff6e8,msg);
  ::UniValue::write_abi_cxx11_((UniValue *)&local_7f0,(int)&response,(void *)0x0,0);
  tinyformat::format<int,long,long>
            (&local_810,
             (tinyformat *)
             "[{\"success\":false,\"error\":{\"code\":-1,\"message\":\"Rescan failed for key with creation timestamp %d. There was an error reading a block from time %d, which is after or within %d seconds of key creation, and could contain transactions pertaining to the key. As a result, transactions and coins using this key may not appear in the wallet. This error could be caused by pruning or data corruption (see bitcoind log for details) and could be dealt with by downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain RPC).\"}},{\"success\":true}]"
             ,&stack0xfffffffffffff6c4,(int *)&stack0xfffffffffffff6b8,&TIMESTAMP_WINDOW,
             (long *)__args_2);
  if (local_7e8._M_p == (pointer)local_810._M_string_length) {
    if (local_7e8._M_p == (pointer)0x0) {
      local_828.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar8 = bcmp(local_7f0,local_810._M_dataplus._M_p,(size_t)local_7e8._M_p);
      local_828.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar8 == 0);
    }
  }
  else {
    local_828.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_828.m_message.px = (element_type *)0x0;
  local_828.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_830 = "";
  local_7c0._8_8_ = &local_840;
  local_7d0[8] = '\0';
  local_7d0._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_7c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_848 = &local_868;
  local_858 = 0;
  local_860 = &PTR__lazy_ostream_01388fc8;
  local_850 = boost::unit_test::lazy_ostream::inst;
  local_868 = &local_810;
  local_840 = (UniValue *)&local_7f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_828,(lazy_ostream *)&stack0xfffffffffffff6c8,1,2,REQUIRE,0xf64cb6,
             (size_t)&local_838,0xfe,(RPCHelpMan *)local_7d0,
             "tfm::format(\"[{\\\"success\\\":false,\\\"error\\\":{\\\"code\\\":-1,\\\"message\\\":\\\"Rescan failed for key with creation \" \"timestamp %d. There was an error reading a block from time %d, which is after or within %d \" \"seconds of key creation, and could contain transactions pertaining to the key. As a result, \" \"transactions and coins using this key may not appear in the wallet. This error could be caused \" \"by pruning or data corruption (see bitcoind log for details) and could be dealt with by \" \"downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain \" \"RPC).\\\"}},{\\\"success\\\":true}]\", 0, oldTip->GetBlockTimeMax(), TIMESTAMP_WINDOW)"
             ,&local_860);
  boost::detail::shared_count::~shared_count(&local_828.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
  }
  if (local_7f0 != local_7e0) {
    operator_delete(local_7f0,local_7e0[0] + 1);
  }
  RemoveWallet(&context,&wallet,(optional<bool>)0x0);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&response.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&response.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)response.val._M_dataplus._M_p != &response.val.field_2) {
    operator_delete(response.val._M_dataplus._M_p,
                    CONCAT44(response.val.field_2._M_allocated_capacity._4_4_,
                             response.val.field_2._M_allocated_capacity._0_4_) + 1);
  }
  JSONRPCRequest::~JSONRPCRequest((JSONRPCRequest *)&criticalblock30);
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_8f0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_8f0,
               local_8f0._M_head_impl);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&key.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&key.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)key.val._M_dataplus._M_p != &key.val.field_2) {
    operator_delete(key.val._M_dataplus._M_p,
                    CONCAT71(key.val.field_2._M_allocated_capacity._1_7_,
                             key.val.field_2._M_local_buf[0]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&keys.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keys.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)keys.val._M_dataplus._M_p != &keys.val.field_2) {
    operator_delete(keys.val._M_dataplus._M_p,
                    CONCAT71(keys.val.field_2._M_allocated_capacity._1_7_,
                             keys.val.field_2._M_local_buf[0]) + 1);
  }
  WalletContext::~WalletContext(&context);
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(importmulti_rescan, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify importmulti RPC returns failure for a key whose creation time is
    // before the missing block, and success for a key whose creation time is
    // after.
    {
        const std::shared_ptr<CWallet> wallet = std::make_shared<CWallet>(m_node.chain.get(), "", CreateMockableWalletDatabase());
        wallet->SetupLegacyScriptPubKeyMan();
        WITH_LOCK(wallet->cs_wallet, wallet->SetLastBlockProcessed(newTip->nHeight, newTip->GetBlockHash()));
        WalletContext context;
        context.args = &m_args;
        AddWallet(context, wallet);
        UniValue keys;
        keys.setArray();
        UniValue key;
        key.setObject();
        key.pushKV("scriptPubKey", HexStr(GetScriptForRawPubKey(coinbaseKey.GetPubKey())));
        key.pushKV("timestamp", 0);
        key.pushKV("internal", UniValue(true));
        keys.push_back(key);
        key.clear();
        key.setObject();
        CKey futureKey = GenerateRandomKey();
        key.pushKV("scriptPubKey", HexStr(GetScriptForRawPubKey(futureKey.GetPubKey())));
        key.pushKV("timestamp", newTip->GetBlockTimeMax() + TIMESTAMP_WINDOW + 1);
        key.pushKV("internal", UniValue(true));
        keys.push_back(std::move(key));
        JSONRPCRequest request;
        request.context = &context;
        request.params.setArray();
        request.params.push_back(std::move(keys));

        UniValue response = importmulti().HandleRequest(request);
        BOOST_CHECK_EQUAL(response.write(),
            strprintf("[{\"success\":false,\"error\":{\"code\":-1,\"message\":\"Rescan failed for key with creation "
                      "timestamp %d. There was an error reading a block from time %d, which is after or within %d "
                      "seconds of key creation, and could contain transactions pertaining to the key. As a result, "
                      "transactions and coins using this key may not appear in the wallet. This error could be caused "
                      "by pruning or data corruption (see bitcoind log for details) and could be dealt with by "
                      "downloading and rescanning the relevant blocks (see -reindex option and rescanblockchain "
                      "RPC).\"}},{\"success\":true}]",
                              0, oldTip->GetBlockTimeMax(), TIMESTAMP_WINDOW));
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt);
    }
}